

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O0

Mock * __thiscall Model<Mock>::save(Model<Mock> *this)

{
  Mock *pMVar1;
  pair<int,_Mock> local_28;
  Model<Mock> *local_10;
  Model<Mock> *this_local;
  
  local_10 = this;
  pMVar1 = (Mock *)__dynamic_cast(this,&typeinfo,&Mock::typeinfo,0);
  if (pMVar1 == (Mock *)0x0) {
    __cxa_bad_cast();
  }
  std::pair<int,_Mock>::pair<int_&,_Mock_&,_true>(&local_28,&this->id,pMVar1);
  std::map<int,Mock,std::less<int>,std::allocator<std::pair<int_const,Mock>>>::
  insert<std::pair<int,Mock>>
            ((map<int,Mock,std::less<int>,std::allocator<std::pair<int_const,Mock>>> *)&objectList,
             &local_28);
  pMVar1 = (Mock *)__dynamic_cast(this,&typeinfo,&Mock::typeinfo,0);
  if (pMVar1 == (Mock *)0x0) {
    __cxa_bad_cast();
  }
  return pMVar1;
}

Assistant:

T &Model<T>::save() {
    Model<T>::objectList.insert(pair<int, T>(this->id, dynamic_cast<T &> (*this)));
    return dynamic_cast<T &> (*this);
}